

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

PPrototype * __thiscall FxExpression::ReturnProto(FxExpression *this)

{
  PPrototype *pPVar1;
  TArray<PType_*,_PType_*> ret;
  TArray<PType_*,_PType_*> none;
  TArray<PType_*,_PType_*> TStack_28;
  TArray<PType_*,_PType_*> local_18;
  
  if (this->ValueType != (PType *)0x0) {
    TArray<PType_*,_PType_*>::TArray(&TStack_28,0);
    TArray<PType_*,_PType_*>::TArray(&local_18,0);
    if (this->ValueType != &TypeVoid->super_PType) {
      TArray<PType_*,_PType_*>::Push(&TStack_28,&this->ValueType);
    }
    pPVar1 = NewPrototype(&TStack_28,&local_18);
    TArray<PType_*,_PType_*>::~TArray(&local_18);
    TArray<PType_*,_PType_*>::~TArray(&TStack_28);
    return pPVar1;
  }
  __assert_fail("ValueType != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x11b,"virtual PPrototype *FxExpression::ReturnProto()");
}

Assistant:

PPrototype *FxExpression::ReturnProto()
{
	assert(ValueType != nullptr);

	TArray<PType *> ret(0);
	TArray<PType *> none(0);
	if (ValueType != TypeVoid)
	{
		ret.Push(ValueType);
	}

	return NewPrototype(ret, none);
}